

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidylib.c
# Opt level: O0

TidyDocImpl * tidyDocCreate(TidyAllocator *allocator)

{
  TidyDocImpl *doc_00;
  StreamOut *pSVar1;
  TidyDocImpl *doc;
  TidyAllocator *allocator_local;
  
  doc_00 = (TidyDocImpl *)(*allocator->vtbl->alloc)(allocator,0x33d8);
  memset(doc_00,0,0x33d8);
  doc_00->allocator = allocator;
  prvTidyInitMap();
  prvTidyInitTags(doc_00);
  prvTidyInitAttrs(doc_00);
  prvTidyInitConfig(doc_00);
  prvTidyInitPrintBuf(doc_00);
  pSVar1 = prvTidyStdErrOutput();
  doc_00->errout = pSVar1;
  return doc_00;
}

Assistant:

TidyDocImpl* tidyDocCreate( TidyAllocator *allocator )
{
    TidyDocImpl* doc = (TidyDocImpl*)TidyAlloc( allocator, sizeof(TidyDocImpl) );
    TidyClearMemory( doc, sizeof(*doc) );
    doc->allocator = allocator;

    TY_(InitMap)();
    TY_(InitTags)( doc );
    TY_(InitAttrs)( doc );
    TY_(InitConfig)( doc );
    TY_(InitPrintBuf)( doc );

    /* By default, wire tidy messages to standard error.
    ** Document input will be set by parsing routines.
    ** Document output will be set by pretty print routines.
    ** Config input will be set by config parsing routines.
    ** But we need to start off with a way to report errors.
    */
    doc->errout = TY_(StdErrOutput)();
    return doc;
}